

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O0

void __thiscall
SQVM::Raise_ParamTypeError(SQVM *this,SQInteger nparam,SQInteger typemask,SQInteger type)

{
  SQSharedState *ss;
  SQString *pSVar1;
  SQChar *pSVar2;
  SQObjectPtr local_80 [2];
  SQObjectPtr local_60;
  ulong local_50;
  SQInteger mask;
  SQInteger i;
  SQInteger found;
  SQObjectPtr exptypes;
  SQInteger type_local;
  SQInteger typemask_local;
  SQInteger nparam_local;
  SQVM *this_local;
  
  exptypes.super_SQObject._unVal.nInteger = type;
  pSVar1 = SQString::Create(this->_sharedstate,"",-1);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&found,pSVar1);
  i = 0;
  for (mask = 0; mask < 0x10; mask = mask + 1) {
    local_50 = 1L << ((byte)mask & 0x3f);
    if ((typemask & local_50) != 0) {
      if (0 < i) {
        pSVar1 = SQString::Create(this->_sharedstate,"|",-1);
        ::SQObjectPtr::SQObjectPtr(&local_60,pSVar1);
        StringCat(this,(SQObjectPtr *)&found,&local_60,(SQObjectPtr *)&found);
        ::SQObjectPtr::~SQObjectPtr(&local_60);
      }
      i = i + 1;
      ss = this->_sharedstate;
      pSVar2 = IdType2Name((SQObjectType)local_50);
      pSVar1 = SQString::Create(ss,pSVar2,-1);
      ::SQObjectPtr::SQObjectPtr(local_80,pSVar1);
      StringCat(this,(SQObjectPtr *)&found,local_80,(SQObjectPtr *)&found);
      ::SQObjectPtr::~SQObjectPtr(local_80);
    }
  }
  pSVar2 = IdType2Name((SQObjectType)exptypes.super_SQObject._unVal.fFloat);
  Raise_Error(this,"parameter %d has an invalid type \'%s\' ; expected: \'%s\'",nparam,pSVar2,
              exptypes.super_SQObject._0_8_ + 0x38);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&found);
  return;
}

Assistant:

void SQVM::Raise_ParamTypeError(SQInteger nparam,SQInteger typemask,SQInteger type)
{
    SQObjectPtr exptypes = SQString::Create(_ss(this), _SC(""), -1);
    SQInteger found = 0;
    for(SQInteger i=0; i<16; i++)
    {
        SQInteger mask = ((SQInteger)1) << i;
        if(typemask & (mask)) {
            if(found>0) StringCat(exptypes,SQString::Create(_ss(this), _SC("|"), -1), exptypes);
            found ++;
            StringCat(exptypes,SQString::Create(_ss(this), IdType2Name((SQObjectType)mask), -1), exptypes);
        }
    }
    Raise_Error(_SC("parameter %d has an invalid type '%s' ; expected: '%s'"), nparam, IdType2Name((SQObjectType)type), _stringval(exptypes));
}